

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_expect_true(mpack_reader_t *reader)

{
  _Bool _Var1;
  mpack_reader_t *reader_local;
  
  _Var1 = mpack_expect_bool(reader);
  if (!_Var1) {
    mpack_reader_flag_error(reader,mpack_error_type);
  }
  return;
}

Assistant:

void mpack_expect_true(mpack_reader_t* reader) {
    if (mpack_expect_bool(reader) != true)
        mpack_reader_flag_error(reader, mpack_error_type);
}